

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTableCell::doAction(QAccessibleTableCell *this,QString *actionName)

{
  bool bVar1;
  ulong uVar2;
  QString *in_RDI;
  QAccessibleTableCell *in_stack_00000008;
  QString *in_stack_ffffffffffffffd8;
  
  QAccessibleActionInterface::toggleAction();
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    uVar2 = (*(code *)(in_RDI->d).d[0xd].super_QArrayData.alloc)();
    if ((uVar2 & 1) == 0) {
      selectCell(in_stack_00000008);
    }
    else {
      unselectCell(this);
    }
  }
  return;
}

Assistant:

void QAccessibleTableCell::doAction(const QString& actionName)
{
    if (actionName == toggleAction()) {
#if defined(Q_OS_ANDROID)
        QAccessibleInterface *parentInterface = parent();
        while (parentInterface){
            if (parentInterface->role() == QAccessible::ComboBox) {
                selectCell();
                parentInterface->actionInterface()->doAction(pressAction());
                return;
            } else {
                parentInterface = parentInterface->parent();
            }
        }
#endif
        if (isSelected()) {
            unselectCell();
        } else {
            selectCell();
        }
    }
}